

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

optional<unsigned_long> __thiscall wasm::WATParser::Token::getI64(Token *this)

{
  bool bVar1;
  unsigned_long *__t;
  long *__t_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar2;
  optional<unsigned_long> oVar3;
  optional<long> oVar4;
  _Storage<long,_true> local_40;
  optional<long> n_1;
  optional<unsigned_long> n;
  Token *this_local;
  bool local_10;
  
  oVar3 = getU64(this);
  n_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_ =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)
                     &n_1.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._M_engaged);
  if (bVar1) {
    __t = std::optional<unsigned_long>::operator*
                    ((optional<unsigned_long> *)
                     &n_1.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._M_engaged);
    std::optional<unsigned_long>::optional<unsigned_long_&,_true>
              ((optional<unsigned_long> *)&this_local,__t);
    uVar2 = extraout_RDX;
  }
  else {
    oVar4 = getS64(this);
    local_40._M_value =
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    n_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value._0_1_ =
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_40);
    if (bVar1) {
      __t_00 = std::optional<long>::operator*((optional<long> *)&local_40);
      std::optional<unsigned_long>::optional<long_&,_true>
                ((optional<unsigned_long> *)&this_local,__t_00);
      uVar2 = extraout_RDX_00;
    }
    else {
      std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
      uVar2 = extraout_RDX_01;
    }
  }
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = local_10;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = (_Storage<unsigned_long,_true>)this_local
  ;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<uint64_t> Token::getI64() const {
  if (auto n = getU64()) {
    return *n;
  }
  if (auto n = getS64()) {
    return *n;
  }
  return {};
}